

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::focusEvent(QWidgetTextControlPrivate *this,QFocusEvent *e)

{
  long lVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  QWidgetTextControl *pQVar5;
  ulong uVar6;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControl *q;
  QRectF *in_stack_ffffffffffffff98;
  TextInteractionFlag other;
  QFlagsStorage<Qt::TextInteractionFlag> other_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_30;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_2c;
  undefined1 in_stack_ffffffffffffffdf;
  QWidgetTextControlPrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  other_00.i = (Int)pQVar5;
  QWidgetTextControl::selectionRect
            ((QWidgetTextControl *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  QWidgetTextControl::updateRequest((QWidgetTextControl *)in_RDI,in_stack_ffffffffffffff98);
  bVar2 = QFocusEvent::gotFocus((QFocusEvent *)0x718256);
  if (bVar2) {
    other = (TextInteractionFlag)((ulong)&in_RDI->interactionFlags >> 0x20);
    Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
    local_2c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
         (QFlagsStorage<Qt::TextInteractionFlag>)
         QFlags<Qt::TextInteractionFlag>::operator&
                   ((QFlags<Qt::TextInteractionFlag> *)in_RDI,
                    (QFlags<Qt::TextInteractionFlag>)other_00.i);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    in_RDI->cursorOn = IVar3 != 0;
    local_30.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
         (QFlagsStorage<Qt::TextInteractionFlag>)
         QFlags<Qt::TextInteractionFlag>::operator&((QFlags<Qt::TextInteractionFlag> *)in_RDI,other)
    ;
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
    if (IVar3 != 0) {
      setCursorVisible(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
    }
  }
  else {
    setCursorVisible(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
    in_RDI->cursorOn = false;
    if (((((in_RDI->cursorIsFocusIndicator & 1U) != 0) &&
         (iVar4 = QFocusEvent::reason(), iVar4 != 3)) && (iVar4 = QFocusEvent::reason(), iVar4 != 4)
        ) && (uVar6 = QTextCursor::hasSelection(), (uVar6 & 1) != 0)) {
      QTextCursor::clearSelection();
    }
  }
  bVar2 = QFocusEvent::gotFocus((QFocusEvent *)0x718357);
  in_RDI->hasFocus = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::focusEvent(QFocusEvent *e)
{
    Q_Q(QWidgetTextControl);
    emit q->updateRequest(q->selectionRect());
    if (e->gotFocus()) {
#ifdef QT_KEYPAD_NAVIGATION
        if (!QApplicationPrivate::keypadNavigationEnabled() || (hasEditFocus && (e->reason() == Qt::PopupFocusReason))) {
#endif
        cursorOn = (interactionFlags & (Qt::TextSelectableByKeyboard | Qt::TextEditable));
        if (interactionFlags & Qt::TextEditable) {
            setCursorVisible(true);
        }
#ifdef QT_KEYPAD_NAVIGATION
        }
#endif
    } else {
        setCursorVisible(false);
        cursorOn = false;

        if (cursorIsFocusIndicator
            && e->reason() != Qt::ActiveWindowFocusReason
            && e->reason() != Qt::PopupFocusReason
            && cursor.hasSelection()) {
            cursor.clearSelection();
        }
    }
    hasFocus = e->gotFocus();
}